

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.h
# Opt level: O2

bool __thiscall
leveldb::anon_unknown_0::BloomFilterPolicy::KeyMayMatch
          (BloomFilterPolicy *this,Slice *key,Slice *bloom_filter)

{
  long lVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  uint32_t uVar5;
  uint uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  bool bVar8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = bloom_filter->size_;
  if (uVar2 < 2) {
    bVar8 = false;
  }
  else {
    pcVar3 = bloom_filter->data_;
    uVar7 = (ulong)pcVar3[uVar2 - 1];
    bVar8 = true;
    this = (BloomFilterPolicy *)key;
    if (uVar7 < 0x1f) {
      uVar5 = BloomHash(key);
      uVar6 = uVar5 << 0xf | uVar5 >> 0x11;
      this = (BloomFilterPolicy *)(ulong)uVar6;
      while( true ) {
        bVar8 = uVar7 == 0;
        uVar7 = uVar7 - 1;
        if ((bVar8) ||
           (auVar4._8_8_ = 0, auVar4._0_8_ = uVar2 * 8 - 8,
           ((byte)pcVar3[SUB168(ZEXT416(uVar5) % auVar4,0) >> 3 & 0x1fffffff] >>
            (SUB164(ZEXT416(uVar5) % auVar4,0) & 7) & 1) == 0)) break;
        uVar5 = uVar5 + uVar6;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar8;
  }
  __stack_chk_fail(this);
}

Assistant:

size_t size() const { return size_; }